

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal-inl.h
# Opt level: O1

void __thiscall testing::internal::GTestFlagSaver::GTestFlagSaver(GTestFlagSaver *this)

{
  (this->color_)._M_dataplus._M_p = (pointer)&(this->color_).field_2;
  (this->color_)._M_string_length = 0;
  (this->color_).field_2._M_local_buf[0] = '\0';
  (this->death_test_style_)._M_dataplus._M_p = (pointer)&(this->death_test_style_).field_2;
  (this->death_test_style_)._M_string_length = 0;
  (this->death_test_style_).field_2._M_local_buf[0] = '\0';
  (this->filter_)._M_dataplus._M_p = (pointer)&(this->filter_).field_2;
  (this->filter_)._M_string_length = 0;
  (this->filter_).field_2._M_local_buf[0] = '\0';
  (this->internal_run_death_test_)._M_dataplus._M_p =
       (pointer)&(this->internal_run_death_test_).field_2;
  (this->internal_run_death_test_)._M_string_length = 0;
  (this->internal_run_death_test_).field_2._M_local_buf[0] = '\0';
  (this->output_)._M_dataplus._M_p = (pointer)&(this->output_).field_2;
  (this->output_)._M_string_length = 0;
  (this->output_).field_2._M_local_buf[0] = '\0';
  (this->stream_result_to_)._M_dataplus._M_p = (pointer)&(this->stream_result_to_).field_2;
  (this->stream_result_to_)._M_string_length = 0;
  (this->stream_result_to_).field_2._M_local_buf[0] = '\0';
  this->also_run_disabled_tests_ = (bool)FLAGS_gtest_also_run_disabled_tests;
  this->break_on_failure_ = (bool)FLAGS_gtest_break_on_failure;
  this->catch_exceptions_ = (bool)FLAGS_gtest_catch_exceptions;
  std::__cxx11::string::_M_assign((string *)&this->color_);
  std::__cxx11::string::_M_assign((string *)&this->death_test_style_);
  this->death_test_use_fork_ = (bool)FLAGS_gtest_death_test_use_fork;
  std::__cxx11::string::_M_assign((string *)&this->filter_);
  std::__cxx11::string::_M_assign((string *)&this->internal_run_death_test_);
  this->list_tests_ = (bool)FLAGS_gtest_list_tests;
  std::__cxx11::string::_M_assign((string *)&this->output_);
  this->print_time_ = (bool)FLAGS_gtest_print_time;
  this->random_seed_ = FLAGS_gtest_random_seed;
  this->repeat_ = FLAGS_gtest_repeat;
  this->shuffle_ = (bool)FLAGS_gtest_shuffle;
  this->stack_trace_depth_ = FLAGS_gtest_stack_trace_depth;
  std::__cxx11::string::_M_assign((string *)&this->stream_result_to_);
  this->throw_on_failure_ = (bool)FLAGS_gtest_throw_on_failure;
  return;
}

Assistant:

GTestFlagSaver() {
    also_run_disabled_tests_ = GTEST_FLAG(also_run_disabled_tests);
    break_on_failure_ = GTEST_FLAG(break_on_failure);
    catch_exceptions_ = GTEST_FLAG(catch_exceptions);
    color_ = GTEST_FLAG(color);
    death_test_style_ = GTEST_FLAG(death_test_style);
    death_test_use_fork_ = GTEST_FLAG(death_test_use_fork);
    filter_ = GTEST_FLAG(filter);
    internal_run_death_test_ = GTEST_FLAG(internal_run_death_test);
    list_tests_ = GTEST_FLAG(list_tests);
    output_ = GTEST_FLAG(output);
    print_time_ = GTEST_FLAG(print_time);
    random_seed_ = GTEST_FLAG(random_seed);
    repeat_ = GTEST_FLAG(repeat);
    shuffle_ = GTEST_FLAG(shuffle);
    stack_trace_depth_ = GTEST_FLAG(stack_trace_depth);
    stream_result_to_ = GTEST_FLAG(stream_result_to);
    throw_on_failure_ = GTEST_FLAG(throw_on_failure);
  }